

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::visitRootTableAccessExpr
          (CodegenVisitor *this,RootTableAccessExpr *expr)

{
  CodegenVisitor *in_RSI;
  long in_RDI;
  SQInteger unaff_retaddr;
  SQOpcode in_stack_0000000c;
  SQFuncState *in_stack_00000010;
  Expr *in_stack_ffffffffffffffe8;
  SQFuncState *this_00;
  long arg1;
  
  arg1 = in_RDI;
  maybeAddInExprLine(in_RSI,in_stack_ffffffffffffffe8);
  this_00 = *(SQFuncState **)(in_RDI + 8);
  SQFuncState::PushTarget(this_00,in_RDI);
  SQFuncState::AddInstruction
            (in_stack_00000010,in_stack_0000000c,unaff_retaddr,arg1,(SQInteger)in_RSI,
             (SQInteger)this_00);
  return;
}

Assistant:

void CodegenVisitor::visitRootTableAccessExpr(RootTableAccessExpr *expr) {
    maybeAddInExprLine(expr);
    _fs->AddInstruction(_OP_LOADROOT, _fs->PushTarget());
}